

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool negative_binomial_check(int a,double b)

{
  double b_local;
  int a_local;
  
  if (a < 0) {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"NEGATIVE_BINOMIAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  A < 0.\n");
    b_local._7_1_ = false;
  }
  else if ((b <= 0.0) || (1.0 < b)) {
    std::operator<<((ostream *)&std::cout," \n");
    std::operator<<((ostream *)&std::cout,"NEGATIVE_BINOMIAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cout,"  B <= 0 or 1 < B.\n");
    b_local._7_1_ = false;
  }
  else {
    b_local._7_1_ = true;
  }
  return b_local._7_1_;
}

Assistant:

bool negative_binomial_check ( int a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NEGATIVE_BINOMIAL_CHECK checks parameters of the Negative Binomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, double B, parameters of the PDF.
//    0 <= A,
//    0 < B <= 1.
//
//    Output, bool NEGATIVE_BINOMIAL_CHECK, is true if the
//    parameters are legal.
//
{
  if ( a < 0 )
  {
    cout << " \n";
    cout << "NEGATIVE_BINOMIAL_CHECK - Warning!\n";
    cout << "  A < 0.\n";
    return false;
  }

  if ( b <= 0.0 || 1.0 < b )
  {
    cout << " \n";
    cout << "NEGATIVE_BINOMIAL_CHECK - Warning!\n";
    cout << "  B <= 0 or 1 < B.\n";
    return false;
  }

  return true;
}